

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O2

Vec_Ptr_t * Gia_IsoDeriveEquivPos(Gia_Man_t *pGia,int fForward,int fVerbose)

{
  long lVar1;
  int Iter;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  abctime aVar5;
  Gia_IsoMan_t *p;
  abctime aVar6;
  long lVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  ulong uVar10;
  int level;
  Gia_IsoMan_t *pGVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  
  uVar9 = (ulong)(uint)fForward;
  aVar4 = Abc_Clock();
  aVar5 = Abc_Clock();
  if (pGia->vCis->nSize < 1) {
    __assert_fail("Gia_ManCiNum(pGia) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIso.c"
                  ,0x2d9,"Vec_Ptr_t *Gia_IsoDeriveEquivPos(Gia_Man_t *, int, int)");
  }
  if (pGia->vCos->nSize <= pGia->nRegs) {
    __assert_fail("Gia_ManPoNum(pGia) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIso.c"
                  ,0x2da,"Vec_Ptr_t *Gia_IsoDeriveEquivPos(Gia_Man_t *, int, int)");
  }
  Gia_ManCleanValue(pGia);
  p = Gia_IsoManStart(pGia);
  Gia_IsoPrepare(p);
  pGVar11 = p;
  Gia_IsoAssignUnique(p);
  aVar6 = Abc_Clock();
  p->timeStart = aVar6 - aVar4;
  if (fVerbose != 0) {
    aVar4 = Abc_Clock();
    uVar9 = 0;
    pGVar11 = p;
    Gia_IsoPrint(p,0,aVar4 - aVar5);
  }
  if (fForward == 0) {
    uVar12 = 0;
    do {
      if (p->vClasses->nSize < 1) break;
      uVar14 = 1;
      while (((int)uVar12 < 10000 && (uVar14 != 0))) {
        uVar14 = 0;
        iVar2 = 0;
        while (((int)uVar12 < 10000 && (iVar2 < 2))) {
          aVar4 = Abc_Clock();
          uVar9 = (ulong)uVar12;
          Gia_IsoSimulate(p,uVar12);
          aVar6 = Abc_Clock();
          p->timeSim = p->timeSim + (aVar6 - aVar4);
          aVar4 = Abc_Clock();
          uVar3 = Gia_IsoSort(p);
          aVar6 = Abc_Clock();
          p->timeRefine = p->timeRefine + (aVar6 - aVar4);
          uVar12 = uVar12 + 1;
          if (fVerbose != 0) {
            aVar4 = Abc_Clock();
            uVar9 = (ulong)uVar12;
            Gia_IsoPrint(p,uVar12,aVar4 - aVar5);
          }
          uVar14 = uVar14 | uVar3;
          iVar2 = iVar2 + 1;
          if (uVar3 != 0) {
            iVar2 = 0;
          }
        }
        iVar2 = 0;
        while (((int)uVar12 < 10000 && (iVar2 < 2))) {
          aVar4 = Abc_Clock();
          uVar9 = (ulong)uVar12;
          Gia_IsoSimulateBack(p,uVar12);
          aVar6 = Abc_Clock();
          p->timeSim = p->timeSim + (aVar6 - aVar4);
          aVar4 = Abc_Clock();
          uVar3 = Gia_IsoSort(p);
          aVar6 = Abc_Clock();
          p->timeRefine = p->timeRefine + (aVar6 - aVar4);
          uVar12 = uVar12 + 1;
          if (fVerbose != 0) {
            aVar4 = Abc_Clock();
            uVar9 = (ulong)uVar12;
            Gia_IsoPrint(p,uVar12,aVar4 - aVar5);
          }
          uVar14 = uVar14 | uVar3;
          iVar2 = iVar2 + 1;
          if (uVar3 != 0) {
            iVar2 = 0;
          }
        }
      }
    } while (uVar14 != 0);
    while (iVar2 = (int)uVar9, 0 < p->vClasses->nSize) {
      uVar9 = (ulong)(uint)fVerbose;
      Gia_IsoAssignOneClass(p,fVerbose);
      uVar14 = 1;
      while (((int)uVar12 < 10000 && (uVar14 != 0))) {
        bVar15 = true;
        uVar14 = 0;
        while (((int)uVar12 < 10000 && (bVar15))) {
          aVar4 = Abc_Clock();
          uVar9 = (ulong)uVar12;
          Gia_IsoSimulateBack(p,uVar12);
          aVar6 = Abc_Clock();
          p->timeSim = p->timeSim + (aVar6 - aVar4);
          aVar4 = Abc_Clock();
          uVar3 = Gia_IsoSort(p);
          aVar6 = Abc_Clock();
          p->timeRefine = p->timeRefine + (aVar6 - aVar4);
          uVar12 = uVar12 + 1;
          if (fVerbose != 0) {
            aVar4 = Abc_Clock();
            uVar9 = (ulong)uVar12;
            Gia_IsoPrint(p,uVar12,aVar4 - aVar5);
          }
          uVar14 = uVar14 | uVar3;
          bVar15 = uVar3 != 0;
        }
        bVar15 = true;
        while (((int)uVar12 < 10000 && (bVar15))) {
          aVar4 = Abc_Clock();
          uVar9 = (ulong)uVar12;
          Gia_IsoSimulate(p,uVar12);
          aVar6 = Abc_Clock();
          p->timeSim = p->timeSim + (aVar6 - aVar4);
          aVar4 = Abc_Clock();
          uVar3 = Gia_IsoSort(p);
          aVar6 = Abc_Clock();
          p->timeRefine = p->timeRefine + (aVar6 - aVar4);
          uVar12 = uVar12 + 1;
          if (fVerbose != 0) {
            aVar4 = Abc_Clock();
            uVar9 = (ulong)uVar12;
            Gia_IsoPrint(p,uVar12,aVar4 - aVar5);
          }
          uVar14 = uVar14 | uVar3;
          bVar15 = uVar3 != 0;
        }
      }
    }
    if (fVerbose == 0) goto LAB_005e4535;
    aVar4 = Abc_Clock();
    pGVar11 = p;
    Gia_IsoPrint(p,uVar12 + 2,aVar4 - aVar5);
    level = (int)pGVar11;
  }
  else {
    uVar10 = 1;
    iVar13 = 0;
    while( true ) {
      level = (int)pGVar11;
      iVar2 = (int)uVar9;
      Iter = (int)uVar10;
      uVar12 = Iter - 1;
      if ((9999 < uVar12) || (1 < iVar13)) break;
      aVar4 = Abc_Clock();
      uVar9 = (ulong)uVar12;
      Gia_IsoSimulate(p,uVar12);
      aVar6 = Abc_Clock();
      p->timeSim = p->timeSim + (aVar6 - aVar4);
      aVar4 = Abc_Clock();
      pGVar11 = p;
      iVar2 = Gia_IsoSort(p);
      aVar6 = Abc_Clock();
      p->timeRefine = p->timeRefine + (aVar6 - aVar4);
      if (fVerbose != 0) {
        aVar4 = Abc_Clock();
        pGVar11 = p;
        Gia_IsoPrint(p,Iter,aVar4 - aVar5);
        uVar9 = uVar10;
      }
      iVar13 = iVar13 + 1;
      if (iVar2 != 0) {
        iVar13 = 0;
      }
      uVar10 = (ulong)(Iter + 1);
    }
    if (fVerbose == 0) goto LAB_005e4535;
  }
  aVar4 = Abc_Clock();
  lVar1 = p->timeRefine;
  dVar16 = 0.0;
  lVar7 = aVar4 - aVar5;
  dVar18 = (double)lVar7;
  if (lVar7 != 0) {
    dVar16 = (dVar18 * 100.0) / dVar18;
  }
  lVar7 = lVar7 - (p->timeStart + p->timeSim + lVar1);
  dVar21 = (double)p->timeStart;
  dVar19 = 0.0;
  bVar15 = aVar4 - aVar5 != 0;
  p->timeTotal = aVar4 - aVar5;
  p->timeOther = lVar7;
  if (bVar15) {
    dVar19 = (dVar21 * 100.0) / dVar18;
  }
  dVar22 = (double)p->timeSim;
  dVar23 = 0.0;
  if (bVar15) {
    dVar23 = (dVar22 * 100.0) / dVar18;
  }
  dVar17 = (double)lVar7;
  dVar20 = 0.0;
  if (bVar15) {
    dVar20 = (dVar17 * 100.0) / dVar18;
  }
  Abc_Print(level,"%s =","Start    ");
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar21 / 1000000.0,dVar19);
  Abc_Print(level,"%s =","Simulate ");
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar22 / 1000000.0,dVar23);
  Abc_Print(level,"%s =","Refine   ");
  dVar21 = (double)p->timeSort;
  dVar19 = 0.0;
  if (aVar4 != aVar5) {
    dVar19 = (dVar21 * 100.0) / dVar18;
  }
  dVar23 = (double)(lVar1 - p->timeSort);
  dVar22 = 0.0;
  if (aVar4 != aVar5) {
    dVar22 = (dVar23 * 100.0) / dVar18;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar23 / 1000000.0,dVar22);
  Abc_Print(level,"%s =","Sort     ");
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar21 / 1000000.0,dVar19);
  Abc_Print(level,"%s =","Other    ");
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar17 / 1000000.0,dVar20);
  Abc_Print(level,"%s =","TOTAL    ");
  iVar2 = 0x7ae5e7;
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar18 / 1000000.0,dVar16);
LAB_005e4535:
  if (p->pGia->vCos->nSize - p->pGia->nRegs < 2) {
    pVVar8 = (Vec_Ptr_t *)0x0;
  }
  else {
    pVVar8 = Gia_IsoCollectCosClasses(p,iVar2);
  }
  Gia_IsoManTransferUnique(p);
  Gia_IsoManStop(p);
  return pVVar8;
}

Assistant:

Vec_Ptr_t * Gia_IsoDeriveEquivPos( Gia_Man_t * pGia, int fForward, int fVerbose )
{
    int nIterMax = 10000;
    int nFixedPoint = 1;
    Gia_IsoMan_t * p;
    Vec_Ptr_t * vEquivs = NULL;
    int fRefined, fRefinedAll;
    int i, c;
    abctime clk = Abc_Clock(), clkTotal = Abc_Clock();
    assert( Gia_ManCiNum(pGia) > 0 );
    assert( Gia_ManPoNum(pGia) > 0 );

    Gia_ManCleanValue( pGia );
    p = Gia_IsoManStart( pGia );
    Gia_IsoPrepare( p );
    Gia_IsoAssignUnique( p );
    p->timeStart = Abc_Clock() - clk;
    if ( fVerbose )
        Gia_IsoPrint( p, 0, Abc_Clock() - clkTotal );

//    Gia_IsoRecognizeMuxes( pGia );

    i = 0;
    if ( fForward )
    {
        for ( c = 0; i < nIterMax && c < nFixedPoint+1; i++, c = fRefined ? 0 : c+1 )
        {
            clk = Abc_Clock();   Gia_IsoSimulate( p, i );      p->timeSim += Abc_Clock() - clk;
            clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
            if ( fVerbose )
                Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
        }
    }
    else
    {
        while ( Vec_IntSize(p->vClasses) > 0 )
        {
            for ( fRefinedAll = 1; i < nIterMax && fRefinedAll; )
            {
                fRefinedAll = 0;
                for ( c = 0; i < nIterMax && c < nFixedPoint+1; i++, c = fRefined ? 0 : c+1 )
                {
                    clk = Abc_Clock();   Gia_IsoSimulate( p, i );      p->timeSim += Abc_Clock() - clk;
                    clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
                    if ( fVerbose )
                        Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
                    fRefinedAll |= fRefined;
                }
                for ( c = 0; i < nIterMax && c < nFixedPoint+1; i++, c = fRefined ? 0 : c+1 )
                {
                    clk = Abc_Clock();   Gia_IsoSimulateBack( p, i );  p->timeSim += Abc_Clock() - clk;
                    clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
                    if ( fVerbose )
                        Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
                    fRefinedAll |= fRefined;
                }
            }
            if ( !fRefinedAll )
                break;
        }

//        Gia_IsoReportTopmost( p );

        while ( Vec_IntSize(p->vClasses) > 0 )
        {
            Gia_IsoAssignOneClass( p, fVerbose );
            for ( fRefinedAll = 1; i < nIterMax && fRefinedAll; )
            {
                fRefinedAll = 0;
                for ( c = 0; i < nIterMax && c < nFixedPoint; i++, c = fRefined ? 0 : c+1 )
                {
                    clk = Abc_Clock();   Gia_IsoSimulateBack( p, i );  p->timeSim += Abc_Clock() - clk;
                    clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
                    if ( fVerbose )
                        Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
                    fRefinedAll |= fRefined;
                }
                for ( c = 0; i < nIterMax && c < nFixedPoint; i++, c = fRefined ? 0 : c+1 )
                {
                    clk = Abc_Clock();   Gia_IsoSimulate( p, i );      p->timeSim += Abc_Clock() - clk;
                    clk = Abc_Clock();   fRefined = Gia_IsoSort( p );  p->timeRefine += Abc_Clock() - clk;
                    if ( fVerbose )
                        Gia_IsoPrint( p, i+1, Abc_Clock() - clkTotal );
                    fRefinedAll |= fRefined;
//                    if ( fRefined )
//                        printf( "Refinedment happened.\n" );
                }
            }
        }

        if ( fVerbose )
            Gia_IsoPrint( p, i+2, Abc_Clock() - clkTotal );
    }
//    Gia_IsoPrintClasses( p );
    if ( fVerbose )
    {
        p->timeTotal = Abc_Clock() - clkTotal;
        p->timeOther = p->timeTotal - p->timeStart - p->timeSim - p->timeRefine;
        ABC_PRTP( "Start    ", p->timeStart,              p->timeTotal );
        ABC_PRTP( "Simulate ", p->timeSim,                p->timeTotal );
        ABC_PRTP( "Refine   ", p->timeRefine-p->timeSort, p->timeTotal );
        ABC_PRTP( "Sort     ", p->timeSort,               p->timeTotal );
        ABC_PRTP( "Other    ", p->timeOther,              p->timeTotal );
        ABC_PRTP( "TOTAL    ", p->timeTotal,              p->timeTotal );
    }

    if ( Gia_ManPoNum(p->pGia) > 1 )
        vEquivs = Gia_IsoCollectCosClasses( p, fVerbose );
    Gia_IsoManTransferUnique( p );
    Gia_IsoManStop( p );

    return vEquivs;
}